

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O1

int AF_A_SerpentChooseAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  uint uVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c11e6;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar9 = param;
    uVar8 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (this->super_DThinker).super_DObject.Class;
      bVar10 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar10;
      uVar8 = (uint)bVar10;
      pVVar9 = (VMValue *)(ulong)(pPVar7 == pPVar4 || bVar10);
      if (pPVar7 != pPVar4 && !bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c11e6;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c11bb;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c11e6;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar3 = (this->target).field_0.p;
      if (pAVar3 != (AActor *)0x0) {
        if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          bVar10 = AActor::CheckMeleeRange(this);
          if ((!bVar10) && (this->MissileState != (FState *)0x0)) {
            AActor::SetState(this,this->MissileState,false);
          }
        }
        else {
          (this->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c11bb:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c11e6:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0xaa,
                "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentChooseAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target || self->CheckMeleeRange())
	{
		return 0;
	}
	if (self->MissileState != NULL)
	{
		self->SetState (self->MissileState);
	}
	return 0;
}